

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

value_type *
winmd::reader::FixedArgSig::read_arg
          (value_type *__return_storage_ptr__,ElementType type,bool is_array,byte_view *data)

{
  uint uVar1;
  uint32_t uVar2;
  ElemSig local_a8;
  uint local_78;
  allocator<char> local_71;
  uint32_t i;
  uint local_3c;
  undefined1 local_38 [4];
  uint num_elements;
  vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> elems;
  byte_view *data_local;
  bool is_array_local;
  value_type *pvStack_10;
  ElementType type_local;
  
  elems.super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  data_local._6_1_ = is_array;
  data_local._7_1_ = type;
  pvStack_10 = __return_storage_ptr__;
  if (is_array) {
    cppwinrt::std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>::vector
              ((vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> *)local_38);
    uVar1 = read<unsigned_int>((byte_view *)
                               elems.
                               super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_3c = uVar1;
    if (uVar1 != 0xffffffff) {
      uVar2 = byte_view::size((byte_view *)
                              elems.
                              super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (uVar2 < uVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i,"Invalid blob array size",&local_71);
        impl::throw_invalid((string *)&i);
      }
      cppwinrt::std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>::
      reserve((vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> *)local_38,
              (ulong)local_3c);
      for (local_78 = 0; local_78 < local_3c; local_78 = local_78 + 1) {
        std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>::
        emplace_back<winmd::reader::ElementType&,winmd::reader::byte_view&>
                  ((vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>> *)local_38
                   ,(ElementType *)((long)&data_local + 7),
                   (byte_view *)
                   elems.
                   super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    std::
    variant<winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
    ::
    variant<std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>,void,void,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>,void>
              ((variant<winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                *)__return_storage_ptr__,
               (vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> *)local_38);
    cppwinrt::std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>::~vector
              ((vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> *)local_38);
  }
  else {
    ElemSig::ElemSig(&local_a8,type,data);
    std::
    variant<winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
    ::variant<winmd::reader::ElemSig,void,void,winmd::reader::ElemSig,void>
              ((variant<winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                *)__return_storage_ptr__,&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

static value_type read_arg(ElementType type, bool is_array, byte_view& data)
        {
            if (is_array)
            {
                std::vector<ElemSig> elems;
                auto const num_elements = read<uint32_t>(data);
                if (num_elements != 0xffffffff)
                {
                    if (num_elements > data.size())
                    {
                        impl::throw_invalid("Invalid blob array size");
                    }
                    elems.reserve(num_elements);
                    for (uint32_t i = 0; i < num_elements; ++i)
                    {
                        elems.emplace_back(type, data);
                    }
                }
                return elems;
            }
            else
            {
                return ElemSig{ type, data };
            }
        }